

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O0

charcount_t Js::JavascriptString::GetBufferLength(char16 *content)

{
  bool bVar1;
  size_t charCount;
  size_t cchActual;
  char16 *content_local;
  
  charCount = PAL_wcslen(content);
  bVar1 = IsValidCharCount(charCount);
  if (!bVar1) {
    Throw::OutOfMemory();
  }
  return (charcount_t)charCount;
}

Assistant:

charcount_t
    JavascriptString::GetBufferLength(const char16 * content)
    {
        size_t cchActual = wcslen(content);

#if defined(TARGET_64)
        if (!IsValidCharCount(cchActual))
        {
            // Limit javascript string to 31-bit length
            Js::Throw::OutOfMemory();
        }
#else
        // There shouldn't be enough memory to have UINT_MAX character.
        // INT_MAX is the upper bound for 32-bit;
        Assert(IsValidCharCount(cchActual));
#endif
        return static_cast<charcount_t>(cchActual);
    }